

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form3_Shift(ShiftForm3 Shift)

{
  uint8_t value;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined8 in_XMM3_Qb;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  double local_80;
  double local_78;
  Image output;
  Image input;
  
  auVar4 = in_ZMM0._0_16_;
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar3 = input._width - (roiWidth + roiX);
  if (roiX < uVar3) {
    uVar3 = roiX;
  }
  auVar5 = vcvtusi2sd_avx512f(auVar4,uVar3);
  uVar3 = input._height - (roiHeight + roiY);
  if (roiY < uVar3) {
    uVar3 = roiY;
  }
  auVar4 = vcvtusi2sd_avx512f(auVar4,uVar3);
  local_80 = auVar4._0_8_;
  local_78 = Unit_Test::randomFloatValue<double>(auVar5._0_8_ * -0.25,auVar5._0_8_ * 0.25,1.0);
  iVar2 = rand();
  auVar4._0_8_ = (double)(iVar2 % 100);
  auVar4._8_8_ = in_XMM3_Qb;
  auVar4 = vfmadd132sd_fma(auVar4,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  local_78 = auVar4._0_8_ + local_78;
  local_80 = Unit_Test::randomFloatValue<double>(local_80 * -0.25,local_80 * 0.25,1.0);
  iVar2 = rand();
  auVar5._0_8_ = (double)(iVar2 % 100);
  auVar5._8_8_ = in_XMM3_Qb;
  auVar4 = vfmadd132sd_fma(auVar5,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  (*Shift)(&output,&input,roiX,roiY,roiWidth,roiHeight,local_78,auVar4._0_8_ + local_80);
  bVar1 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
  if (bVar1) {
    bVar1 = Unit_Test::verifyImage(&output,value);
  }
  else {
    bVar1 = false;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return bVar1;
}

Assistant:

bool form3_Shift(ShiftForm3 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const double maxShiftX = roiX < (input.width()  - roiWidth  - roiX) ? roiX : (input.width()  - roiWidth  - roiX);
        const double maxShiftY = roiY < (input.height() - roiHeight - roiY) ? roiY : (input.height() - roiHeight - roiY);
        const double shiftX = randomFloatValue<double>( -maxShiftX / 4, maxShiftX / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -maxShiftY / 4, maxShiftY / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, roiX, roiY, roiWidth, roiHeight, shiftX, shiftY );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity );
    }